

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Url.cpp
# Opt level: O0

bool __thiscall xmrig::Url::isEqual(Url *this,Url *other)

{
  bool bVar1;
  byte *in_RSI;
  String *in_RDI;
  String *in_stack_ffffffffffffffd8;
  bool local_11;
  
  local_11 = false;
  if (((*(byte *)&in_RDI->m_data & 1) == (*in_RSI & 1)) &&
     (local_11 = false, *(int *)((long)&in_RDI->m_data + 4) == *(int *)(in_RSI + 4))) {
    bVar1 = String::operator==(in_RDI,in_stack_ffffffffffffffd8);
    local_11 = false;
    if (bVar1) {
      bVar1 = String::operator==(in_RDI,in_stack_ffffffffffffffd8);
      local_11 = false;
      if (bVar1) {
        local_11 = (short)in_RDI[2].m_size == *(short *)(in_RSI + 0x28);
      }
    }
  }
  return local_11;
}

Assistant:

bool xmrig::Url::isEqual(const Url &other) const
{
    return (m_tls == other.m_tls && m_scheme == other.m_scheme && m_host == other.m_host && m_url == other.m_url && m_port == other.m_port);
}